

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iio.c
# Opt level: O0

void interrupt(char *data,void *args)

{
  int iVar1;
  long lVar2;
  int local_2c;
  int i;
  mraa_iio_channel *channels;
  mraa_iio_context thisdevice;
  void *args_local;
  char *data_local;
  
  lVar2 = mraa_iio_get_channels(args);
  for (local_2c = 0; iVar1 = mraa_iio_get_channel_count(args), local_2c < iVar1;
      local_2c = local_2c + 1) {
    if ((*(int *)(lVar2 + (long)local_2c * 0x38 + 4) != 0) &&
       (fprintf(_stdout,"channel %d - bytes %d\n",(ulong)*(uint *)(lVar2 + (long)local_2c * 0x38),
                (ulong)*(uint *)(lVar2 + 0x2c + (long)local_2c * 0x38)),
       *(int *)(lVar2 + 0x2c + (long)local_2c * 0x38) == 2)) {
      printword(*(uint16_t *)(data + *(uint *)(lVar2 + (long)local_2c * 0x38 + 0x34)),
                (mraa_iio_channel *)(lVar2 + (long)local_2c * 0x38));
    }
  }
  return;
}

Assistant:

void
interrupt(char* data, void* args)
{
    mraa_iio_context thisdevice = (mraa_iio_context) args;
    mraa_iio_channel* channels = mraa_iio_get_channels(thisdevice);
    int i = 0;

    for (; i < mraa_iio_get_channel_count(thisdevice); i++) {
        if (channels[i].enabled) {
            fprintf(stdout, "channel %d - bytes %d\n", channels[i].index, channels[i].bytes);
            switch (channels[i].bytes) {
                case 2:
                    printword(*(uint16_t*) (data + channels[i].location), &channels[i]);
            }
        }
    }
}